

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

Point * __thiscall Point::ToString_abi_cxx11_(Point *this)

{
  ostream *poVar1;
  float *in_RSI;
  ostringstream local_190 [8];
  ostringstream oss;
  Point *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  std::operator<<(poVar1,"]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string Point::ToString()
{
    std::ostringstream oss;
    oss << "[" << mX << " , " << mY << "]";
    return oss.str();
}